

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# i2cdev.cpp
# Opt level: O1

bool __thiscall I2Cdev::writeWords(I2Cdev *this,uint16_t regAddr,uint8_t length,uint16_t *data)

{
  ushort *puVar1;
  uint __fd;
  int iVar2;
  ulong uVar3;
  undefined7 in_register_00000011;
  byte bVar4;
  i2c_rdwr_ioctl_data msgset;
  i2c_msg msgs [2];
  uint8_t buf [128];
  undefined1 local_a6 [126];
  
  uVar3 = CONCAT71(in_register_00000011,length) & 0xffffffff;
  bVar4 = (byte)uVar3;
  if (bVar4 < 0x40) {
    __fd = open(&(this->super_I2Cgeneric).field_0xd,2);
    if ((int)__fd < 0) {
      writeWords();
    }
    else {
      iVar2 = ioctl(__fd,0x703,(ulong)(byte)(this->super_I2Cgeneric).field_0xc);
      if (iVar2 < 0) {
        writeWords((I2Cdev *)(ulong)__fd);
      }
      else {
        if (bVar4 != 0) {
          uVar3 = 0;
          do {
            puVar1 = data + uVar3;
            *puVar1 = *puVar1 << 8 | *puVar1 >> 8;
            uVar3 = uVar3 + 1;
          } while (length != uVar3);
        }
        memcpy(local_a6,data,(ulong)(uint)((int)CONCAT71(in_register_00000011,length) * 2));
        ioctl(__fd,0x707);
        close(__fd);
      }
    }
  }
  else {
    fprintf(_stderr,"Word write count (%d) > 63\n",uVar3);
  }
  return bVar4 < 0x40;
}

Assistant:

bool I2Cdev::writeWords(uint16_t regAddr, uint8_t length, uint16_t* data) {
    int8_t count = 0;
    uint8_t buf[128];

    if (length > 63) {
        fprintf(stderr, "Word write count (%d) > 63\n", length);
        return(FALSE);
    }

    int fd = open(this->i2c_path, O_RDWR);

    if (fd < 0) {
        fprintf(stderr, "Failed to open device: %s\n", strerror(errno));
        return(-1);
    }
    if (ioctl(fd, I2C_SLAVE, this->address) < 0) {
        fprintf(stderr, "Failed to select device: %s\n", strerror(errno));
        close(fd);
        return(-1);
    }

    int err;
    buf[0] = (uint8_t)(regAddr >> 8);
    buf[1] = (uint8_t)(regAddr & 0xff);

    //Convert little to big endian
    bswap_table(length, data);
    /*for (unsigned int i = 0; i < length; i++) {
        buf[i*2+2] = data[i] >> 8;
        buf[i*2+3] = data[i];
    }*/
    memcpy(buf+2, data, length*2);

    struct i2c_rdwr_ioctl_data msgset;
    struct i2c_msg msgs[2] = {
        {
            .addr = this->address,
            .flags = 0,
            .len = (uint8_t)(2 + length*2),
            .buf = buf,
        }
    };

    msgset.msgs = msgs;
    msgset.nmsgs = 1;

    err = ioctl(fd, I2C_RDWR, &msgset);
    close(fd);

    return TRUE;
}